

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

int __thiscall crnlib::dynamic_string::find_left(dynamic_string *this,char *p,bool case_sensitive)

{
  int iVar1;
  size_t sVar2;
  undefined7 in_register_00000011;
  long lVar3;
  code *pcVar4;
  
  sVar2 = strlen(p);
  if ((int)CONCAT71(in_register_00000011,case_sensitive) == 0) {
    pcVar4 = strncasecmp;
  }
  else {
    pcVar4 = strncmp;
  }
  lVar3 = 0;
  while( true ) {
    if ((int)((uint)this->m_len - (int)sVar2) < lVar3) {
      return -1;
    }
    iVar1 = (*pcVar4)(p,this->m_pStr + lVar3,(long)(int)sVar2);
    if (iVar1 == 0) break;
    lVar3 = lVar3 + 1;
  }
  return (int)lVar3;
}

Assistant:

int dynamic_string::find_left(const char* p, bool case_sensitive) const
    {
        CRNLIB_ASSERT(p);

        const int p_len = (int)strlen(p);

        for (int i = 0; i <= (m_len - p_len); i++)
        {
            if ((case_sensitive ? strncmp : _strnicmp)(p, &m_pStr[i], p_len) == 0)
            {
                return i;
            }
        }

        return -1;
    }